

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void __thiscall
Js::JavascriptArray::ChangeArrayTypeToNativeArray<double>
          (JavascriptArray *this,JavascriptArray *varArray,ScriptContext *scriptContext)

{
  Type *addr;
  DynamicType *pDVar1;
  JavascriptLibrary *pJVar2;
  DynamicTypeHandler *pDVar3;
  _func_int **pp_Var4;
  code *pcVar5;
  bool bVar6;
  int iVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  INT_PTR *pIVar10;
  
  bVar6 = VarIs<Js::JavascriptNativeArray,Js::JavascriptArray>(varArray);
  if (bVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x727,"(!VarIs<JavascriptNativeArray>(varArray))",
                                "Ensure that the incoming Array is a Var array");
    if (!bVar6) goto LAB_00b6f3e5;
    *puVar9 = 0;
  }
  addr = &(varArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type;
  pDVar1 = (DynamicType *)
           (varArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr;
  pJVar2 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  if (pDVar1 == (pJVar2->arrayType).ptr) {
    pDVar1 = (pJVar2->nativeFloatArrayType).ptr;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = &pDVar1->super_Type;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  else {
    if (pDVar1->isLocked == true) {
      pDVar3 = (pDVar1->typeHandler).ptr;
      iVar7 = (*pDVar3->_vptr_DynamicTypeHandler[0x4e])(pDVar3);
      if (iVar7 == 0) {
        DynamicObject::ChangeType((DynamicObject *)varArray);
      }
      else {
        (*pDVar3->_vptr_DynamicTypeHandler[0x4a])(pDVar3,varArray);
      }
    }
    addr->ptr->typeId = TypeIds_ArrayLast;
  }
  BVar8 = CrossSite::IsCrossSiteObjectTyped<Js::JavascriptArray>(varArray);
  pp_Var4 = (varArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
  if (BVar8 == 0) {
    if (pp_Var4 == (_func_int **)VirtualTableInfo<Js::JavascriptArray>::Address) {
      pIVar10 = &VirtualTableInfo<Js::JavascriptNativeFloatArray>::Address;
      goto LAB_00b6f3d4;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x749,
                                "(VirtualTableInfo<JavascriptArray>::HasVirtualTable(varArray))",
                                "VirtualTableInfo<JavascriptArray>::HasVirtualTable(varArray)");
    if (!bVar6) goto LAB_00b6f3e5;
    pIVar10 = &VirtualTableInfo<Js::JavascriptNativeFloatArray>::Address;
  }
  else {
    if (pp_Var4 ==
        (_func_int **)VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptArray>_>::Address) {
      pIVar10 = &VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeFloatArray>_>::Address;
      goto LAB_00b6f3d4;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x744,
                                "(VirtualTableInfo<CrossSiteObject<JavascriptArray>>::HasVirtualTable(varArray))"
                                ,
                                "VirtualTableInfo<CrossSiteObject<JavascriptArray>>::HasVirtualTable(varArray)"
                               );
    if (!bVar6) {
LAB_00b6f3e5:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    pIVar10 = &VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeFloatArray>_>::Address;
  }
  *puVar9 = 0;
LAB_00b6f3d4:
  (varArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)*pIVar10;
  return;
}

Assistant:

void JavascriptArray::ChangeArrayTypeToNativeArray<double>(JavascriptArray * varArray, ScriptContext * scriptContext)
    {
        AssertMsg(!VarIs<JavascriptNativeArray>(varArray), "Ensure that the incoming Array is a Var array");

        if (varArray->GetType() == scriptContext->GetLibrary()->GetArrayType())
        {
            varArray->type = scriptContext->GetLibrary()->GetNativeFloatArrayType();
        }
        else
        {
            if (varArray->GetDynamicType()->GetIsLocked())
            {
                DynamicTypeHandler *typeHandler = varArray->GetDynamicType()->GetTypeHandler();
                if (typeHandler->IsPathTypeHandler())
                {
                    // We can't allow a type with the new type ID to be promoted to the old type.
                    // So go to a dictionary type handler, which will orphan the new type.
                    // This should be a corner case, so the inability to share the new type is unlikely to matter.
                    // If it does matter, try building a path from the new type's built-in root.
                    static_cast<PathTypeHandlerBase*>(typeHandler)->ResetTypeHandler(varArray);
                }
                else
                {
                    varArray->ChangeType();
                }
            }
            varArray->GetType()->SetTypeId(TypeIds_NativeFloatArray);
        }

        if (CrossSite::IsCrossSiteObjectTyped(varArray))
        {
            Assert(VirtualTableInfo<CrossSiteObject<JavascriptArray>>::HasVirtualTable(varArray));
            VirtualTableInfo<CrossSiteObject<JavascriptNativeFloatArray>>::SetVirtualTable(varArray);
        }
        else
        {
            Assert(VirtualTableInfo<JavascriptArray>::HasVirtualTable(varArray));
            VirtualTableInfo<JavascriptNativeFloatArray>::SetVirtualTable(varArray);
        }
    }